

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesFabricPortSetConfig(zes_fabric_port_handle_t hPort,zes_fabric_port_config_t *pConfig)

{
  zes_pfnFabricPortSetConfig_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnFabricPortSetConfig_t pfnSetConfig;
  zes_fabric_port_config_t *pConfig_local;
  zes_fabric_port_handle_t hPort_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->FabricPort).pfnSetConfig;
    if (p_Var1 == (zes_pfnFabricPortSetConfig_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hPort_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hPort_local._4_4_ = (*p_Var1)(hPort,pConfig);
    }
  }
  else {
    hPort_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hPort_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesFabricPortSetConfig(
    zes_fabric_port_handle_t hPort,                 ///< [in] Handle for the component.
    const zes_fabric_port_config_t* pConfig         ///< [in] Contains new configuration of the Fabric Port.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnFabricPortSetConfig_t pfnSetConfig = [&result] {
        auto pfnSetConfig = ze_lib::context->zesDdiTable.load()->FabricPort.pfnSetConfig;
        if( nullptr == pfnSetConfig ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetConfig;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetConfig( hPort, pConfig );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetConfig = ze_lib::context->zesDdiTable.load()->FabricPort.pfnSetConfig;
    if( nullptr == pfnSetConfig ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetConfig( hPort, pConfig );
    #endif
}